

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

void get_range<double,long>
               (size_t *ix_arr,size_t st,size_t end,size_t col_num,double *Xc,long *Xc_ind,
               long *Xc_indptr,MissingAction missing_action,double *xmin,double *xmax,
               bool *unsplittable)

{
  long lVar1;
  ulong *puVar2;
  ulong *puVar3;
  double dVar4;
  long lVar5;
  ulong uVar6;
  ulong *puVar7;
  long lVar8;
  bool bVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong *puVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong *puVar17;
  ulong uVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  
  *xmin = INFINITY;
  *xmax = -INFINITY;
  lVar15 = Xc_indptr[col_num];
  lVar5 = Xc_indptr[col_num + 1];
  bVar9 = true;
  if (lVar5 == lVar15) goto LAB_001e67b1;
  uVar11 = Xc_ind[lVar15];
  if ((long)ix_arr[end] < (long)uVar11) goto LAB_001e67b1;
  lVar1 = lVar5 + -1;
  uVar6 = Xc_ind[lVar1];
  if ((long)uVar6 < (long)ix_arr[st]) goto LAB_001e67b1;
  puVar3 = ix_arr + end;
  puVar13 = ix_arr + st;
  uVar10 = (end - st) + 1;
  if (((long)ix_arr[st] < (long)uVar11 || (ulong)(lVar5 - lVar15) < uVar10) ||
      (long)uVar6 < (long)ix_arr[end]) {
    *xmin = 0.0;
    *xmax = 0.0;
  }
  puVar2 = puVar3 + 1;
  uVar12 = (long)puVar2 - (long)puVar13 >> 3;
  if (missing_action == Fail) {
    while (0 < (long)uVar12) {
      uVar14 = uVar12 >> 1;
      uVar18 = ~uVar14 + uVar12;
      uVar12 = uVar14;
      if (puVar13[uVar14] < uVar11) {
        puVar13 = puVar13 + uVar14 + 1;
        uVar12 = uVar18;
      }
    }
    if (lVar5 == lVar15 || puVar13 == puVar2) goto LAB_001e673e;
    dVar19 = *xmax;
    dVar20 = *xmin;
    lVar8 = lVar1 * 8 + 8;
    uVar11 = 0;
    while (uVar12 = *puVar13, uVar12 <= uVar6) {
      puVar17 = (ulong *)(Xc_ind + lVar15);
      uVar14 = *puVar17;
      if (uVar14 == uVar12) {
        uVar11 = uVar11 + 1;
        dVar4 = Xc[lVar15];
        dVar21 = dVar4;
        if (dVar20 <= dVar4) {
          dVar21 = dVar20;
        }
        dVar20 = dVar21;
        *xmin = dVar20;
        if (dVar4 <= dVar19) {
          dVar4 = dVar19;
        }
        *xmax = dVar4;
        if ((puVar13 == puVar3) || (lVar15 == lVar1)) break;
        puVar13 = puVar13 + 1;
        uVar12 = (long)Xc_ind + (lVar8 - (long)puVar17) >> 3;
        if (0 < (long)uVar12) {
          do {
            uVar14 = uVar12 >> 1;
            uVar18 = ~uVar14 + uVar12;
            uVar12 = uVar14;
            if (puVar17[uVar14] < *puVar13) {
              puVar17 = puVar17 + uVar14 + 1;
              uVar12 = uVar18;
            }
          } while (0 < (long)uVar12);
        }
        lVar15 = (long)puVar17 - (long)Xc_ind;
        dVar19 = dVar4;
LAB_001e6913:
        lVar15 = lVar15 >> 3;
      }
      else {
        if ((long)uVar14 <= (long)uVar12) {
          puVar7 = puVar17 + 1;
          uVar14 = (long)Xc_ind + (lVar8 - (long)(puVar17 + 1)) >> 3;
          while (0 < (long)uVar14) {
            uVar18 = uVar14 >> 1;
            uVar16 = ~uVar18 + uVar14;
            uVar14 = uVar18;
            if (puVar7[uVar18] < uVar12) {
              puVar7 = puVar7 + uVar18 + 1;
              uVar14 = uVar16;
            }
          }
          lVar15 = (long)puVar7 - (long)Xc_ind;
          goto LAB_001e6913;
        }
        puVar13 = puVar13 + 1;
        uVar12 = (long)puVar2 - (long)puVar13 >> 3;
        while (0 < (long)uVar12) {
          uVar18 = uVar12 >> 1;
          uVar16 = ~uVar18 + uVar12;
          uVar12 = uVar18;
          if (puVar13[uVar18] < uVar14) {
            puVar13 = puVar13 + uVar18 + 1;
            uVar12 = uVar16;
          }
        }
      }
      if ((puVar13 == puVar2) || (lVar15 == lVar5)) break;
    }
  }
  else {
    while (0 < (long)uVar12) {
      uVar14 = uVar12 >> 1;
      uVar18 = ~uVar14 + uVar12;
      uVar12 = uVar14;
      if (puVar13[uVar14] < uVar11) {
        puVar13 = puVar13 + uVar14 + 1;
        uVar12 = uVar18;
      }
    }
    if (lVar5 == lVar15 || puVar13 == puVar2) {
LAB_001e673e:
      uVar11 = 0;
    }
    else {
      dVar19 = *xmax;
      dVar20 = *xmin;
      lVar8 = lVar1 * 8 + 8;
      uVar11 = 0;
      while (uVar12 = *puVar13, uVar12 <= uVar6) {
        puVar17 = (ulong *)(Xc_ind + lVar15);
        uVar14 = *puVar17;
        if (uVar14 == uVar12) {
          uVar11 = uVar11 + 1;
          dVar4 = Xc[lVar15];
          dVar21 = dVar4;
          if (dVar20 <= dVar4) {
            dVar21 = dVar20;
          }
          dVar20 = (double)(~-(ulong)NAN(dVar20) & (ulong)dVar21 |
                           -(ulong)NAN(dVar20) & (ulong)dVar4);
          *xmin = dVar20;
          dVar21 = dVar4;
          if (dVar4 <= dVar19) {
            dVar21 = dVar19;
          }
          dVar19 = (double)(~-(ulong)NAN(dVar19) & (ulong)dVar21 |
                           -(ulong)NAN(dVar19) & (ulong)dVar4);
          *xmax = dVar19;
          if ((puVar13 == puVar3) || (lVar15 == lVar1)) break;
          puVar13 = puVar13 + 1;
          uVar12 = (long)Xc_ind + (lVar8 - (long)puVar17) >> 3;
          if (0 < (long)uVar12) {
            do {
              uVar14 = uVar12 >> 1;
              uVar18 = ~uVar14 + uVar12;
              uVar12 = uVar14;
              if (puVar17[uVar14] < *puVar13) {
                puVar17 = puVar17 + uVar14 + 1;
                uVar12 = uVar18;
              }
            } while (0 < (long)uVar12);
          }
          lVar15 = (long)puVar17 - (long)Xc_ind;
LAB_001e66e4:
          lVar15 = lVar15 >> 3;
        }
        else {
          if ((long)uVar14 <= (long)uVar12) {
            puVar7 = puVar17 + 1;
            uVar14 = (long)Xc_ind + (lVar8 - (long)(puVar17 + 1)) >> 3;
            while (0 < (long)uVar14) {
              uVar18 = uVar14 >> 1;
              uVar16 = ~uVar18 + uVar14;
              uVar14 = uVar18;
              if (puVar7[uVar18] < uVar12) {
                puVar7 = puVar7 + uVar18 + 1;
                uVar14 = uVar16;
              }
            }
            lVar15 = (long)puVar7 - (long)Xc_ind;
            goto LAB_001e66e4;
          }
          puVar13 = puVar13 + 1;
          uVar12 = (long)puVar2 - (long)puVar13 >> 3;
          while (0 < (long)uVar12) {
            uVar18 = uVar12 >> 1;
            uVar16 = ~uVar18 + uVar12;
            uVar12 = uVar18;
            if (puVar13[uVar18] < uVar14) {
              puVar13 = puVar13 + uVar18 + 1;
              uVar12 = uVar16;
            }
          }
        }
        if ((puVar13 == puVar2) || (lVar15 == lVar5)) break;
      }
    }
  }
  if (uVar11 < uVar10) {
    dVar19 = *xmin;
    if (0.0 <= *xmin) {
      dVar19 = 0.0;
    }
    *xmin = dVar19;
    dVar19 = *xmax;
    if (*xmax <= 0.0) {
      dVar19 = 0.0;
    }
    *xmax = dVar19;
  }
  dVar19 = *xmin;
  dVar20 = *xmax;
  if (((dVar19 != dVar20) || (NAN(dVar19) || NAN(dVar20))) &&
     (dVar20 != -INFINITY || dVar19 != INFINITY)) {
    bVar9 = NAN(dVar20);
  }
LAB_001e67b1:
  *unsplittable = bVar9;
  return;
}

Assistant:

void get_range(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
               real_t *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
               MissingAction missing_action, double &restrict xmin, double &restrict xmax, bool &unsplittable) noexcept
{
    /* ix_arr must already be sorted beforehand */
    xmin =  HUGE_VAL;
    xmax = -HUGE_VAL;

    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1];
    size_t nnz_col = end_col - st_col;
    end_col--;
    size_t curr_pos = st_col;

    if (!nnz_col || 
        Xc_ind[st_col]         >   (sparse_ix)ix_arr[end] || 
        (sparse_ix)ix_arr[st]  >   Xc_ind[end_col]
        )
    {
        unsplittable = true;
        return;
    }

    if (nnz_col < end - st + 1 ||
        Xc_ind[st_col]  > (sparse_ix)ix_arr[st] ||
        Xc_ind[end_col] < (sparse_ix)ix_arr[end]
        )
    {
        xmin = 0;
        xmax = 0;
    }

    size_t ind_end_col = Xc_ind[end_col];
    size_t nmatches = 0;

    if (missing_action == Fail)
    {
        for (size_t *row = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                nmatches++;
                xmin = (Xc[curr_pos] < xmin)? Xc[curr_pos] : xmin;
                xmax = (Xc[curr_pos] > xmax)? Xc[curr_pos] : xmax;
                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }
    }

    else /* can have NAs */
    {
        for (size_t *row = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                nmatches++;
                xmin = std::fmin(xmin, Xc[curr_pos]);
                xmax = std::fmax(xmax, Xc[curr_pos]);
                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }

    }

    if (nmatches < (end - st + 1))
    {
        xmin = std::fmin(xmin, 0);
        xmax = std::fmax(xmax, 0);
    }

    unsplittable = (xmin == xmax) || (xmin == HUGE_VAL && xmax == -HUGE_VAL) || std::isnan(xmin) || std::isnan(xmax);
}